

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

void Acb_Ntk4DumpWeights(char *pFileNameIn,Vec_Ptr_t *vObjNames,char *pFileName)

{
  uint uVar1;
  char *__s2;
  int iVar2;
  Vec_Int_t *p;
  int *piVar3;
  Acb_Ntk_t *p_00;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  char *__s1;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  iVar2 = vObjNames->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar6 = iVar2;
  }
  p->nSize = 0;
  p->nCap = iVar6;
  if (iVar6 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar6 << 2);
  }
  p->pArray = piVar3;
  p_00 = Acb_VerilogSimpleRead(pFileNameIn,(char *)0x0);
  iVar2 = (p_00->vObjType).nCap;
  iVar6 = (p_00->vFanouts).nCap;
  if (iVar6 < iVar2) {
    pVVar4 = (p_00->vFanouts).pArray;
    if (pVVar4 == (Vec_Int_t *)0x0) {
      pVVar4 = (Vec_Int_t *)malloc((long)iVar2 << 4);
    }
    else {
      pVVar4 = (Vec_Int_t *)realloc(pVVar4,(long)iVar2 << 4);
      iVar6 = (p_00->vFanouts).nCap;
    }
    (p_00->vFanouts).pArray = pVVar4;
    memset(pVVar4 + iVar6,0,(long)(iVar2 - iVar6) << 4);
    (p_00->vFanouts).nCap = iVar2;
  }
  (p_00->vFanouts).nSize = iVar2;
  uVar1 = (p_00->vObjType).nSize;
  uVar5 = (ulong)uVar1;
  if (1 < (int)uVar1) {
    lVar9 = 1;
    do {
      lVar7 = (long)(int)uVar5;
      if (lVar7 <= lVar9) {
LAB_003b1c9c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p_00->vObjType).pArray[lVar9] != '\0') {
        Acb_ObjAddFaninFanout(p_00,(int)lVar9);
        uVar1 = (p_00->vObjType).nSize;
        uVar5 = (ulong)uVar1;
        lVar7 = (long)(int)uVar1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < lVar7);
  }
  iVar2 = vObjNames->nSize;
  if (0 < iVar2) {
    lVar9 = 0;
    do {
      if (1 < (int)uVar5) {
        __s2 = (char *)vObjNames->pArray[lVar9];
        uVar8 = 1;
        do {
          if ((long)(int)uVar5 <= (long)uVar8) goto LAB_003b1c9c;
          if ((p_00->vObjType).pArray[uVar8] != '\0') {
            uVar5 = (ulong)(p_00->vObjName).nSize;
            if ((long)uVar5 < 1) {
              __assert_fail("Acb_NtkHasObjNames(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                            ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
            }
            if (uVar5 <= uVar8) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            __s1 = Abc_NamStr(p_00->pDesign->pStrs,(p_00->vObjName).pArray[uVar8]);
            iVar2 = strcmp(__s1,__s2);
            if (iVar2 == 0) {
              Vec_IntPush(p,(int)uVar8);
            }
          }
          uVar8 = uVar8 + 1;
          uVar5 = (ulong)(p_00->vObjType).nSize;
        } while ((long)uVar8 < (long)uVar5);
        iVar2 = vObjNames->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar2);
  }
  Acb_Ntk4DumpWeightsInt(p_00,p,pFileName);
  Acb_ManFree(p_00->pDesign);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  return;
}

Assistant:

void Acb_Ntk4DumpWeights( char * pFileNameIn, Vec_Ptr_t * vObjNames, char * pFileName )
{
    char * pName; int i, iObj;
    Vec_Int_t * vObjs = Vec_IntAlloc( Vec_PtrSize(vObjNames) );
    Acb_Ntk_t * pNtkF = Acb_VerilogSimpleRead( pFileNameIn, NULL );
    Acb_NtkCreateFanout( pNtkF );
    Vec_PtrForEachEntry( char *, vObjNames, pName, i )
    {
        Acb_NtkForEachObj( pNtkF, iObj )
            if ( !strcmp(Acb_ObjNameStr(pNtkF, iObj), pName) )
                Vec_IntPush( vObjs, iObj );
    }
    Acb_Ntk4DumpWeightsInt( pNtkF, vObjs, pFileName );
    Acb_ManFree( pNtkF->pDesign );
    Vec_IntFree( vObjs );
}